

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O2

void __thiscall
Disa::Vector_Dense<double,_0UL>::Vector_Dense
          (Vector_Dense<double,_0UL> *this,function<double_(unsigned_long)> *lambda,size_t size)

{
  pointer pdVar1;
  ulong __args;
  double dVar2;
  allocator_type local_19;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&this->super_vector<double,_std::allocator<double>_>,size,&local_19);
  pdVar1 = (this->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (__args = 0;
      __args < (ulong)((long)(this->super_vector<double,_std::allocator<double>_>).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      __args = __args + 1) {
    dVar2 = std::function<double_(unsigned_long)>::operator()(lambda,__args);
    pdVar1 = (this->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar1[__args] = dVar2;
  }
  return;
}

Assistant:

explicit Vector_Dense(const std::function<_type(std::size_t)>& lambda, std::size_t size) : std::vector<_type>(size) {
    FOR(i_element, this->size())(*this)[i_element] = lambda(i_element);
  }